

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,ConfigBlockSymbol *config,string_view cellName,string_view libName,
          SourceRange sourceRange)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  pointer ppSVar5;
  DefinitionSymbol *pDVar6;
  SourceLibrary *pSVar7;
  uint uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  byte bVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  size_t sVar16;
  SourceLibrary *pSVar17;
  Diagnostic *this_00;
  char *pcVar18;
  size_t sVar19;
  pointer ppSVar20;
  value_type_pointer __u;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar25;
  undefined1 auVar26 [16];
  format_args args;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view fmt;
  string_view cellName_local;
  string errorName;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  string local_50;
  
  pcVar18 = cellName._M_str;
  sVar19 = cellName._M_len;
  sVar22 = libName._M_len;
  local_78 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
             (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  if ((RootSymbol *)local_78.values_ != (RootSymbol *)0x0) {
    local_78.values_ = local_78.values_ + 4;
  }
  aVar25 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)libName._M_str;
  cellName_local._M_len = sVar19;
  cellName_local._M_str = pcVar18;
  local_70 = sVar19;
  local_68 = pcVar18;
  sVar16 = boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                     ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                       *)&this->definitionMap,
                      (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       *)&local_78);
  uVar23 = sVar16 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar24 = (sVar16 & 0xff) * 4;
  uVar9 = (&UNK_0049e39c)[lVar24];
  uVar10 = (&UNK_0049e39d)[lVar24];
  uVar11 = (&UNK_0049e39e)[lVar24];
  bVar12 = (&UNK_0049e39f)[lVar24];
  uVar21 = 0;
  do {
    pgVar2 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar23;
    bVar14 = pgVar1->m[0xf].n;
    auVar26[0] = -(pgVar1->m[0].n == uVar9);
    auVar26[1] = -(pgVar1->m[1].n == uVar10);
    auVar26[2] = -(pgVar1->m[2].n == uVar11);
    auVar26[3] = -(pgVar1->m[3].n == bVar12);
    auVar26[4] = -(pgVar1->m[4].n == uVar9);
    auVar26[5] = -(pgVar1->m[5].n == uVar10);
    auVar26[6] = -(pgVar1->m[6].n == uVar11);
    auVar26[7] = -(pgVar1->m[7].n == bVar12);
    auVar26[8] = -(pgVar1->m[8].n == uVar9);
    auVar26[9] = -(pgVar1->m[9].n == uVar10);
    auVar26[10] = -(pgVar1->m[10].n == uVar11);
    auVar26[0xb] = -(pgVar1->m[0xb].n == bVar12);
    auVar26[0xc] = -(pgVar1->m[0xc].n == uVar9);
    auVar26[0xd] = -(pgVar1->m[0xd].n == uVar10);
    auVar26[0xe] = -(pgVar1->m[0xe].n == uVar11);
    auVar26[0xf] = -(bVar14 == bVar12);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
    if (uVar15 != 0) {
      ppVar3 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.elements_;
      do {
        uVar8 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        __u = ppVar3 + uVar23 * 0xf + (ulong)uVar8;
        bVar13 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)&local_78,&__u->first);
        if (bVar13) {
          ppSVar20 = (__u->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppSVar5 = (__u->second).first.
                    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00381740;
        }
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      bVar14 = pgVar2[uVar23].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)sVar16 & 7] & bVar14) == 0) break;
    uVar4 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar24 = uVar23 + uVar21;
    uVar21 = uVar21 + 1;
    uVar23 = lVar24 + 1U & uVar4;
  } while (uVar21 <= uVar4);
LAB_0038179a:
  errorName._M_dataplus._M_p = (pointer)&errorName.field_2;
  errorName._M_string_length = 0;
  errorName.field_2._M_local_buf[0] = '\0';
  if (sVar22 == 0) {
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&errorName,&cellName_local);
  }
  else {
    args.field_1.args_ = aVar25.args_;
    args.desc_ = (unsigned_long_long)&local_78;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x5;
    local_78 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)libName._M_str;
    local_70 = sVar22;
    local_68 = pcVar18;
    local_60 = sVar19;
    ::fmt::v11::vformat_abi_cxx11_(&local_50,(v11 *)0x4d41ae,fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&errorName,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this_00 = Scope::addDiag(&((this->root)._M_t.
                             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                            super_Scope,(DiagCode)0x10000d,sourceRange);
  Diagnostic::operator<<(this_00,&errorName);
  std::__cxx11::string::~string((string *)&errorName);
  return (DefinitionSymbol *)0x0;
LAB_00381740:
  if (ppSVar20 == ppSVar5) goto LAB_0038179a;
  pDVar6 = (DefinitionSymbol *)*ppSVar20;
  if (((pDVar6->super_Symbol).kind == Definition) &&
     ((__y._M_str = (pDVar6->sourceLibrary->name)._M_dataplus._M_p,
      __y._M_len = (pDVar6->sourceLibrary->name)._M_string_length,
      bVar13 = std::operator==(libName,__y), bVar13 ||
      ((sVar22 == 0 &&
       (pSVar7 = pDVar6->sourceLibrary, pSVar17 = Symbol::getSourceLibrary(&config->super_Symbol),
       pSVar7 == pSVar17)))))) {
    if ((pDVar6->definitionKind & ~Program) == Module) {
      return pDVar6;
    }
    goto LAB_0038179a;
  }
  ppSVar20 = ppSVar20 + 1;
  goto LAB_00381740;
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const ConfigBlockSymbol& config,
                                                   std::string_view cellName,
                                                   std::string_view libName,
                                                   SourceRange sourceRange) const {
    if (auto defIt = definitionMap.find(std::tuple{cellName, root.get()});
        defIt != definitionMap.end()) {

        const DefinitionSymbol* foundDef = nullptr;
        for (auto defSym : defIt->second.first) {
            if (defSym->kind != SymbolKind::Definition)
                continue;

            auto& def = defSym->as<DefinitionSymbol>();
            if (def.sourceLibrary.name == libName ||
                (libName.empty() && &def.sourceLibrary == config.getSourceLibrary())) {
                foundDef = &def;
                break;
            }
        }

        if (foundDef && (foundDef->definitionKind == DefinitionKind::Module ||
                         foundDef->definitionKind == DefinitionKind::Program)) {
            return foundDef;
        }
    }

    std::string errorName;
    if (!libName.empty())
        errorName = fmt::format("{}.{}", libName, cellName);
    else
        errorName = cellName;

    root->addDiag(diag::InvalidTopModule, sourceRange) << errorName;
    return nullptr;
}